

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *parentContent,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *thisContent,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *parentBacktraces,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *thisBacktraces,
               unsigned_long *contentEndPosition)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  pointer local_80;
  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *local_78;
  unsigned_long *local_70;
  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> local_68;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_80 = (parentContent->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (parentContent->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = parentBacktraces;
  local_70 = contentEndPosition;
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)__last._M_current;
  local_48 = (pointer)local_80;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
            (&local_88,&local_68,&local_48,&cmPropertySentinal_abi_cxx11_);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,local_88
             ,__last,(allocator_type *)&local_88);
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(thisContent->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(thisContent->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(thisContent->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (thisContent->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_48;
  (thisContent->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_40;
  (thisContent->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_38;
  local_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
  vector<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
            ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)&local_48,
             (cmListFileBacktrace *)
             (((long)local_88._M_current - (long)local_80) * 2 +
             (long)(local_78->
                   super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
                   _M_impl.super__Vector_impl_data._M_start),
             (local_78->
             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_88);
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_start =
       (thisBacktraces->
       super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (thisBacktraces->
       super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (thisBacktraces->
       super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (thisBacktraces->super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
  _M_impl.super__Vector_impl_data._M_start = local_48;
  (thisBacktraces->super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
  _M_impl.super__Vector_impl_data._M_finish = local_40;
  (thisBacktraces->super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::~vector(&local_68);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::~vector
            ((vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *)&local_48);
  *local_70 = (long)(thisContent->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(thisContent->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
  return;
}

Assistant:

void InitializeContentFromParent(T& parentContent,
                          T& thisContent,
                          U& parentBacktraces,
                          U& thisBacktraces,
                          V& contentEndPosition)
{
  std::vector<std::string>::const_iterator parentBegin =
      parentContent.begin();
  std::vector<std::string>::const_iterator parentEnd =
      parentContent.end();

  std::vector<std::string>::const_reverse_iterator parentRbegin =
      cmMakeReverseIterator(parentEnd);
  std::vector<std::string>::const_reverse_iterator parentRend =
      parentContent.rend();
  parentRbegin = std::find(parentRbegin, parentRend, cmPropertySentinal);
  std::vector<std::string>::const_iterator parentIt = parentRbegin.base();

  thisContent = std::vector<std::string>(parentIt, parentEnd);

  std::vector<cmListFileBacktrace>::const_iterator btIt =
      parentBacktraces.begin() + std::distance(parentBegin, parentIt);
  std::vector<cmListFileBacktrace>::const_iterator btEnd =
      parentBacktraces.end();

  thisBacktraces = std::vector<cmListFileBacktrace>(btIt, btEnd);

  contentEndPosition = thisContent.size();
}